

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O1

bool __thiscall Json::Reader::parse(Reader *this,istream *sin,Value *root,bool collectComments)

{
  char *beginDoc;
  bool bVar1;
  string doc;
  undefined1 *local_40;
  undefined8 local_38;
  undefined1 local_30;
  undefined7 uStack_2f;
  
  local_38 = 0;
  local_30 = 0;
  local_40 = &local_30;
  std::getline<char,std::char_traits<char>,std::allocator<char>>(sin,(string *)&local_40,-1);
  std::__cxx11::string::_M_assign((string *)&this->document_);
  beginDoc = (this->document_)._M_dataplus._M_p;
  bVar1 = parse(this,beginDoc,beginDoc + (this->document_)._M_string_length,root,collectComments);
  if (local_40 != &local_30) {
    operator_delete(local_40,CONCAT71(uStack_2f,local_30) + 1);
  }
  return bVar1;
}

Assistant:

bool Reader::parse(std::istream& sin, Value& root, bool collectComments) {
  // std::istream_iterator<char> begin(sin);
  // std::istream_iterator<char> end;
  // Those would allow streamed input from a file, if parse() were a
  // template function.

  // Since std::string is reference-counted, this at least does not
  // create an extra copy.
  std::string doc;
  std::getline(sin, doc, (char)EOF);
  return parse(doc, root, collectComments);
}